

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O2

void __thiscall
nnad::FeedForwardNN<double>::SetParameters
          (FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Pars)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *this_00;
  ulong uVar6;
  ulong uVar7;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *this_01;
  coordinates coord;
  int local_5c;
  string local_58;
  
  if (this->_NpPrep + this->_Np !=
      (int)((ulong)((long)(Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "SetParameters: the number of parameters does not match that of the NN plus that of the preprocessing function."
               ,(allocator<char> *)&local_5c);
    Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  local_5c = 0;
  while( true ) {
    iVar1 = this->_Np;
    if (iVar1 <= local_5c) break;
    pmVar5 = std::
             map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
             ::at(&this->_IntMap,&local_5c);
    local_58._M_dataplus._M_p =
         *(pointer *)
          &(pmVar5->super__Tuple_impl<0UL,_bool,_int,_int,_int>).
           super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
    sVar4 = *(size_type *)
             &(pmVar5->super__Tuple_impl<0UL,_bool,_int,_int,_int>).
              super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>;
    local_58._M_string_length._4_1_ = (char)(sVar4 >> 0x20);
    this_01 = &this->_Biases;
    if (local_58._M_string_length._4_1_ != '\0') {
      this_01 = &this->_Links;
    }
    local_58._M_string_length = sVar4;
    this_00 = std::
              map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
              ::at(this_01,(key_type *)&local_58._M_string_length);
    Matrix<double>::SetElement
              (this_00,(int *)((long)&local_58._M_dataplus._M_p + 4),(int *)&local_58,
               (Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + local_5c);
    local_5c = local_5c + 1;
  }
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->_NpPrep;
  if (this->_NpPrep < 1) {
    uVar6 = uVar7;
  }
  pdVar2 = (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pdVar2[uVar7] = pdVar3[(long)iVar1 + uVar7];
  }
  return;
}

Assistant:

void SetParameters(std::vector<T> const& Pars)
    {
      // Check that the size of the parameter vector is equal to the
      // number of parameters of the current NN plus the number of
      // parameters of the preprocessing function.
      if ((int) Pars.size() != _Np + _NpPrep)
        Error("SetParameters: the number of parameters does not match that of the NN plus that of the preprocessing function.");

      // Set links and biases
      for (int ip = 0; ip < _Np; ip++)
        {
          const coordinates coord = _IntMap.at(ip);
          if (std::get<0>(coord))
            _Links.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
          else
            _Biases.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
        }

      // Set preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        _PreprocPars[ip] = Pars[_Np + ip];
    }